

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O1

shared_ptr<AixLog::SinkCout> AixLog::Log::init<AixLog::SinkCout,AixLog::Severity&>(Severity *params)

{
  Log *params_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<AixLog::SinkCout> sVar2;
  initializer_list<std::shared_ptr<AixLog::Sink>_> __l;
  allocator_type local_39;
  shared_ptr<AixLog::Sink> local_38;
  vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_> local_28;
  
  params_00 = instance();
  add_logsink<AixLog::SinkCout,AixLog::Severity&>((Log *)params,(Severity *)params_00);
  local_38.super___shared_ptr<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)params;
  local_38.super___shared_ptr<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(params + 8);
  if (local_38.super___shared_ptr<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = &local_38;
  std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>::
  vector(&local_28,__l,&local_39);
  init((EVP_PKEY_CTX *)&local_28);
  std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>::
  ~vector(&local_28);
  _Var1._M_pi = extraout_RDX;
  if (local_38.super___shared_ptr<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<AixLog::SinkCout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<AixLog::SinkCout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)params;
  return (shared_ptr<AixLog::SinkCout>)
         sVar2.super___shared_ptr<AixLog::SinkCout,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<T> init(Ts&&... params) {
    std::shared_ptr<T> sink =
        Log::instance().add_logsink<T>(std::forward<Ts>(params)...);
    init({sink});
    return sink;
  }